

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::MemberAccessExpressionSyntax::setChild
          (MemberAccessExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  long in_RSI;
  long in_RDI;
  Token TVar2;
  ConstTokenOrSyntax *in_stack_ffffffffffffff98;
  ExpressionSyntax *local_60;
  undefined8 local_40;
  Info *local_38;
  undefined8 local_30;
  Info *local_28;
  ExpressionSyntax *local_20;
  not_null<slang::syntax::ExpressionSyntax_*> local_18 [3];
  
  if (in_RSI == 0) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x72c5af);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_60 = (ExpressionSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x72c5bf);
      local_60 = SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar1);
    }
    local_20 = local_60;
    not_null<slang::syntax::ExpressionSyntax_*>::not_null<slang::syntax::ExpressionSyntax_*>
              (local_18,&local_20);
    *(ExpressionSyntax **)(in_RDI + 0x18) = local_18[0].ptr;
  }
  else if (in_RSI == 1) {
    TVar2 = ConstTokenOrSyntax::token(in_stack_ffffffffffffff98);
    local_30 = TVar2._0_8_;
    *(undefined8 *)(in_RDI + 0x20) = local_30;
    local_28 = TVar2.info;
    *(Info **)(in_RDI + 0x28) = local_28;
  }
  else {
    TVar2 = ConstTokenOrSyntax::token(in_stack_ffffffffffffff98);
    local_40 = TVar2._0_8_;
    *(undefined8 *)(in_RDI + 0x30) = local_40;
    local_38 = TVar2.info;
    *(Info **)(in_RDI + 0x38) = local_38;
  }
  return;
}

Assistant:

void MemberAccessExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: left = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 1: dot = child.token(); return;
        case 2: name = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}